

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.h
# Opt level: O2

char * __thiscall
Memory::HeapInfo::RealAlloc<(Memory::ObjectInfoBits)1,false>
          (HeapInfo *this,Recycler *recycler,size_t sizeCat,size_t size)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  char *pcVar5;
  
  if ((sizeCat == 0) || (0x300 < sizeCat || (sizeCat & 0xf) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                       ,0x287,"(HeapInfo::IsAlignedSmallObjectSize(sizeCat))",
                       "HeapInfo::IsAlignedSmallObjectSize(sizeCat)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  uVar3 = GetBucketIndex(sizeCat);
  pcVar5 = HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>::
           RealAlloc<(Memory::ObjectInfoBits)1,false>
                     ((HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>> *)
                      (this->heapBuckets + uVar3),recycler,sizeCat,size);
  return pcVar5;
}

Assistant:

inline char *
HeapInfo::RealAlloc(Recycler * recycler, size_t sizeCat, size_t size)
{
    Assert(HeapInfo::IsAlignedSmallObjectSize(sizeCat));
    auto& bucket = this->GetBucket<(ObjectInfoBits)(attributes & GetBlockTypeBitMask)>(sizeCat);
    return bucket.template RealAlloc<attributes, nothrow>(recycler, sizeCat, size);
}